

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::~IfcStructuralConnection
          (IfcStructuralConnection *this)

{
  undefined8 *puVar1;
  long *plVar2;
  
  puVar1 = (undefined8 *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  plVar2 = (long *)(&this->field_0xb8 + *(long *)(*(long *)this + -0x18));
  plVar2[-0x17] = 0x8e2068;
  plVar2[0xf] = 0x8e20e0;
  plVar2[-6] = 0x8e2090;
  plVar2[-4] = 0x8e20b8;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *puVar1 = 0x8e2180;
  puVar1[0x26] = 0x8e21a8;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0x148);
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}